

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

int __thiscall HTTPRequest::parse_request_line(HTTPRequest *this,char *str,ssize_t size)

{
  long lVar1;
  char *pcVar2;
  long local_28;
  ssize_t i;
  ssize_t size_local;
  char *str_local;
  HTTPRequest *this_local;
  
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    if (str[local_28] == ' ') {
      std::__cxx11::string::assign((char *)this,(ulong)str);
      break;
    }
  }
  lVar1 = local_28 + 1;
  pcVar2 = str + lVar1;
  local_28 = 0;
  do {
    if (size - lVar1 <= local_28) {
LAB_00111963:
      std::__cxx11::string::assign((char *)&this->version,(ulong)(pcVar2 + local_28 + 1));
      return 0;
    }
    if (pcVar2[local_28] == ' ') {
      std::__cxx11::string::assign((char *)&this->uri,(ulong)pcVar2);
      goto LAB_00111963;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int HTTPRequest::parse_request_line(const char *str, ssize_t size) {
    // TODO
    ssize_t i = size;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->method.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->uri.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    this->version.assign(str, size * sizeof(char));
    return 0;
}